

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestString.cpp
# Opt level: O0

void testString(void)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  usize uVar5;
  char *pcVar6;
  String *pSVar7;
  char *pcVar8;
  String local_cb0;
  List<String> local_c88;
  undefined1 local_c28 [8];
  String str;
  String local_bd8;
  String local_bb0;
  String local_b88;
  String local_b60;
  String local_b38;
  String local_b10;
  String local_ae8;
  String local_ac0;
  String local_a98;
  String local_a70;
  String local_a48;
  String local_a20;
  String local_9f8;
  String local_9d0;
  String local_9a8;
  String local_980;
  String local_958;
  String local_930;
  String local_908;
  String local_8e0;
  String local_8b8;
  String local_890;
  String local_868;
  String local_840;
  undefined1 local_818 [8];
  String bufWrapper_1;
  usize i_2;
  char buf_1 [100];
  String local_778;
  String local_750;
  undefined1 local_728 [8];
  String bufWrapper;
  char *i_1;
  char buf [100];
  char *caa;
  String aa;
  String local_638;
  String local_610;
  String local_5e8;
  undefined1 local_5c0 [8];
  String c;
  String a;
  String b;
  String test;
  undefined1 local_518 [4];
  int i;
  String blupp;
  String local_4c8;
  String local_4a0;
  String local_478;
  String local_450;
  String local_428;
  String local_400;
  String local_3d8;
  String local_3b0;
  String local_388;
  String local_360;
  String local_338;
  String local_310;
  String local_2e8;
  String local_2c0;
  String local_298;
  String local_270;
  String local_248;
  String local_220;
  String local_1f8;
  String local_1d0;
  String local_1a8;
  String local_180;
  String local_158;
  undefined1 local_130 [8];
  String y;
  undefined1 local_e0 [8];
  String x;
  String copyOfCopyOfHello;
  String copyOfHello;
  String hello;
  undefined1 local_30 [8];
  String empty;
  
  String::String((String *)local_30);
  bVar2 = String::isEmpty((String *)local_30);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0xc,"empty.isEmpty()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::String<6ul>((String *)&copyOfHello._data.ref,(char (*) [6])"hello");
  bVar2 = String::isEmpty((String *)&copyOfHello._data.ref);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0xe,"!hello.isEmpty()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::String((String *)&copyOfCopyOfHello._data.ref,(String *)&copyOfHello._data.ref);
  bVar2 = String::isEmpty((String *)&copyOfCopyOfHello._data.ref);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x10,"!copyOfHello.isEmpty()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::String((String *)&x._data.ref,(String *)&copyOfCopyOfHello._data.ref);
  bVar2 = String::isEmpty((String *)&x._data.ref);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x12,"!copyOfCopyOfHello.isEmpty()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::String((String *)local_e0,(String *)&x._data.ref);
  String::operator=((String *)local_e0,(String *)&copyOfCopyOfHello._data.ref);
  String::String<4ul>((String *)&y._data.ref,(char (*) [4])"omg");
  String::operator=((String *)local_e0,(String *)&y._data.ref);
  String::~String((String *)&y._data.ref);
  String::String<4ul>((String *)local_130,(char (*) [4])"omg");
  String::operator=((String *)local_130,(String *)local_130);
  String::~String((String *)local_130);
  String::~String((String *)local_e0);
  String::String<4ul>(&local_158,(char (*) [4])"123");
  String::String<4ul>(&local_180,(char (*) [4])"123");
  iVar4 = String::compare(&local_158,&local_180);
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x1e,"String(\"123\").compare(\"123\") == 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_180);
  String::~String(&local_158);
  String::String<4ul>(&local_1a8,(char (*) [4])"123");
  String::String<4ul>(&local_1d0,(char (*) [4])"xxx");
  iVar4 = String::compare(&local_1a8,&local_1d0);
  if ((iVar4 == 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x1f,"String(\"123\").compare(\"xxx\") != 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_1d0);
  String::~String(&local_1a8);
  String::String<5ul>(&local_1f8,(char (*) [5])"1234");
  String::String<4ul>(&local_220,(char (*) [4])"123");
  iVar4 = String::compare(&local_1f8,&local_220,3);
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x20,"String(\"1234\").compare(\"123\", 3) == 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_220);
  String::~String(&local_1f8);
  String::String<5ul>(&local_248,(char (*) [5])"1234");
  String::String<4ul>(&local_270,(char (*) [4])"xxx");
  iVar4 = String::compare(&local_248,&local_270,3);
  if ((iVar4 == 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x21,"String(\"1234\").compare(\"xxx\", 3) != 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_270);
  String::~String(&local_248);
  String::String<4ul>(&local_298,(char (*) [4])"123");
  String::String<5ul>(&local_2c0,(char (*) [5])"1234");
  iVar4 = String::compare(&local_298,&local_2c0,3);
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x22,"String(\"123\").compare(\"1234\", 3) == 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_2c0);
  String::~String(&local_298);
  String::String<4ul>(&local_2e8,(char (*) [4])"xxx");
  String::String<5ul>(&local_310,(char (*) [5])"1234");
  iVar4 = String::compare(&local_2e8,&local_310,3);
  if ((iVar4 == 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x23,"String(\"xxx\").compare(\"1234\", 3) != 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_310);
  String::~String(&local_2e8);
  String::String<4ul>(&local_338,(char (*) [4])"abc");
  String::String<4ul>(&local_360,(char (*) [4])"ABC");
  iVar4 = String::compareIgnoreCase(&local_338,&local_360);
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x26,"String(\"abc\").compareIgnoreCase(\"ABC\") == 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_360);
  String::~String(&local_338);
  String::String<4ul>(&local_388,(char (*) [4])"abc");
  String::String<4ul>(&local_3b0,(char (*) [4])"xxx");
  iVar4 = String::compareIgnoreCase(&local_388,&local_3b0);
  if ((iVar4 == 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x27,"String(\"abc\").compareIgnoreCase(\"xxx\") != 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_3b0);
  String::~String(&local_388);
  String::String<5ul>(&local_3d8,(char (*) [5])"abcd");
  String::String<4ul>(&local_400,(char (*) [4])"ABC");
  iVar4 = String::compareIgnoreCase(&local_3d8,&local_400,3);
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x28,"String(\"abcd\").compareIgnoreCase(\"ABC\", 3) == 0"), iVar4 != 0
     )) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_400);
  String::~String(&local_3d8);
  String::String<5ul>(&local_428,(char (*) [5])"abcd");
  String::String<4ul>(&local_450,(char (*) [4])"xxx");
  iVar4 = String::compareIgnoreCase(&local_428,&local_450,3);
  if ((iVar4 == 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x29,"String(\"abcd\").compareIgnoreCase(\"xxx\", 3) != 0"), iVar4 != 0
     )) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_450);
  String::~String(&local_428);
  String::String<4ul>(&local_478,(char (*) [4])"abc");
  String::String<5ul>(&local_4a0,(char (*) [5])"ABCD");
  iVar4 = String::compareIgnoreCase(&local_478,&local_4a0,3);
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x2a,"String(\"abc\").compareIgnoreCase(\"ABCD\", 3) == 0"), iVar4 != 0
     )) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_4a0);
  String::~String(&local_478);
  String::String<4ul>(&local_4c8,(char (*) [4])"xxx");
  String::String<5ul>((String *)&blupp._data.ref,(char (*) [5])"ABCD");
  iVar4 = String::compareIgnoreCase(&local_4c8,(String *)&blupp._data.ref,3);
  if ((iVar4 == 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x2b,"String(\"xxx\").compareIgnoreCase(\"ABCD\", 3) != 0"), iVar4 != 0
     )) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String((String *)&blupp._data.ref);
  String::~String(&local_4c8);
  String::String((String *)local_518);
  String::printf((String *)local_518,"%d",0x7b);
  String::operator=((String *)local_518,(String *)local_518);
  bVar2 = String::operator==((String *)local_518,(char (*) [4])"123");
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x31,"blupp == \"123\""), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator==((String *)&copyOfHello._data.ref,(String *)&x._data.ref);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x34,"hello == copyOfCopyOfHello"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator==((String *)&copyOfCopyOfHello._data.ref,(String *)&x._data.ref);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x35,"copyOfHello == copyOfCopyOfHello"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator==((String *)&copyOfHello._data.ref,(String *)&x._data.ref);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x36,"hello == copyOfCopyOfHello"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator!=((String *)&copyOfHello._data.ref,(String *)local_30);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x37,"hello != empty"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator!=((String *)&copyOfCopyOfHello._data.ref,(String *)local_30);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x38,"copyOfHello != empty"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator!=((String *)&x._data.ref,(String *)local_30);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x39,"copyOfCopyOfHello != empty"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator==((String *)&copyOfHello._data.ref,(String *)local_30);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x3a,"!(hello == empty)"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator==((String *)&copyOfCopyOfHello._data.ref,(String *)local_30);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x3b,"!(copyOfHello == empty)"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = String::operator==((String *)&x._data.ref,(String *)local_30);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x3c,"!(copyOfCopyOfHello == empty)"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::clear((String *)&copyOfCopyOfHello._data.ref);
  bVar2 = String::isEmpty((String *)&copyOfCopyOfHello._data.ref);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x40,"copyOfHello.isEmpty()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  for (test._data.ref._4_4_ = 0; (int)test._data.ref._4_4_ < 0x100;
      test._data.ref._4_4_ = test._data.ref._4_4_ + 1) {
    cVar3 = String::toUpperCase(test._data.ref._4_1_);
    iVar4 = toupper(test._data.ref._4_4_ & 0xff);
    if ((cVar3 != (char)iVar4) &&
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                              ,0x45,"String::toUpperCase((char)i) == (char)toupper((uchar&)i)"),
       iVar4 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    cVar3 = String::toLowerCase(test._data.ref._4_1_);
    iVar4 = tolower(test._data.ref._4_4_ & 0xff);
    if ((cVar3 != (char)iVar4) &&
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                              ,0x46,"String::toLowerCase((char)i) == (char)tolower((uchar&)i)"),
       iVar4 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    bVar2 = String::isSpace(test._data.ref._4_1_);
    iVar4 = isspace(test._data.ref._4_4_ & 0xff);
    if ((bVar2 != (iVar4 != 0)) &&
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                              ,0x47,"String::isSpace((char)i) == !!isspace((uchar&)i)"), iVar4 != 0)
       ) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  uVar5 = String::length("");
  if ((uVar5 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x4b,"String::length(\"\") == 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  uVar5 = String::length("123");
  if ((uVar5 != 3) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x4c,"String::length(\"123\") == 3"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::String<34ul>((String *)&b._data.ref,(char (*) [34])"this is the find test test string");
  pcVar6 = String::find((String *)&b._data.ref,'z');
  if ((pcVar6 != (char *)0x0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x50,"test.find(\'z\') == 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::find((String *)&b._data.ref,"zz");
  if ((pcVar6 != (char *)0x0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x51,"test.find(\"zz\") == 0"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::find((String *)&b._data.ref,'i');
  iVar4 = String::compare(pcVar6,"is is the find test test string");
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x52,
                            "String::compare(test.find(\'i\'), \"is is the find test test string\") == 0"
                           ), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::findLast((String *)&b._data.ref,'i');
  iVar4 = String::compare(pcVar6,"ing");
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x53,"String::compare(test.findLast(\'i\'), \"ing\") == 0"), iVar4 != 0
     )) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::find((String *)&b._data.ref,"is");
  iVar4 = String::compare(pcVar6,"is is the find test test string");
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x54,
                            "String::compare(test.find(\"is\"), \"is is the find test test string\") == 0"
                           ), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::findLast((String *)&b._data.ref,"is");
  iVar4 = String::compare(pcVar6,"is the find test test string");
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x55,
                            "String::compare(test.findLast(\"is\"), \"is the find test test string\") == 0"
                           ), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::findOneOf((String *)&b._data.ref,"ex");
  iVar4 = String::compare(pcVar6,"e find test test string");
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x56,
                            "String::compare(test.findOneOf(\"ex\"), \"e find test test string\") == 0"
                           ), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::findOneOf((String *)&b._data.ref,"xe");
  iVar4 = String::compare(pcVar6,"e find test test string");
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x57,
                            "String::compare(test.findOneOf(\"xe\"), \"e find test test string\") == 0"
                           ), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::findLastOf((String *)&b._data.ref,"ex");
  iVar4 = String::compare(pcVar6,"est string");
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x58,"String::compare(test.findLastOf(\"ex\"), \"est string\") == 0"),
     iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pcVar6 = String::findLastOf((String *)&b._data.ref,"xe");
  iVar4 = String::compare(pcVar6,"est string");
  if ((iVar4 != 0) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x59,"String::compare(test.findLastOf(\"xe\"), \"est string\") == 0"),
     iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::String<4ul>((String *)&a._data.ref,(char (*) [4])" b ");
  String::String<3ul>((String *)&c._data.ref,(char (*) [3])0x10f798);
  String::String<3ul>((String *)local_5c0,(char (*) [3])0x10f707);
  String::operator+(&local_610,(String *)&c._data.ref,(String *)&a._data.ref);
  String::operator+(&local_5e8,&local_610,(String *)local_5c0);
  bVar2 = String::operator==(&local_5e8,(char (*) [8])"aa b cc");
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x5f,"a + b + c == \"aa b cc\""), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_5e8);
  String::~String(&local_610);
  String::String(&local_638);
  pSVar7 = String::append(&local_638,(String *)&c._data.ref);
  pSVar7 = String::append(pSVar7,(String *)&a._data.ref);
  pSVar7 = String::append(pSVar7,(String *)local_5c0);
  bVar2 = String::operator==(pSVar7,(char (*) [8])"aa b cc");
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x60,"String().append(a).append(b).append(c) == \"aa b cc\""),
     iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_638);
  String::String((String *)&aa._data.ref);
  pSVar7 = String::append((String *)&aa._data.ref,(String *)&a._data.ref);
  pSVar7 = String::prepend(pSVar7,(String *)&c._data.ref);
  pSVar7 = String::append(pSVar7,(String *)local_5c0);
  bVar2 = String::operator==(pSVar7,(char (*) [8])"aa b cc");
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x61,"String().append(b).prepend(a).append(c) == \"aa b cc\""),
     iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String((String *)&aa._data.ref);
  testString::LazyCopyTest::test1();
  pcVar6 = String::operator_cast_to_char_((String *)&caa);
  unique0x10003510 = pcVar6;
  pcVar8 = String::operator_cast_to_char_((String *)&caa);
  if ((pcVar6 == pcVar8) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x6d,"caa != (char*)aa"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  for (bufWrapper._data.ref = (usize)&i_1; bufWrapper._data.ref < buf;
      bufWrapper._data.ref = bufWrapper._data.ref + 1) {
    *(undefined1 *)bufWrapper._data.ref = 0x61;
  }
  String::String((String *)local_728);
  String::attach((String *)local_728,(char *)&i_1,4);
  String::String(&local_750,(char *)&i_1,4);
  bVar2 = String::operator==((String *)local_728,&local_750);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x75,"bufWrapper == String(buf, 4)"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_750);
  String::String<5ul>(&local_778,(char (*) [5])0x10f7d9);
  bVar2 = String::operator==((String *)local_728,&local_778);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x76,"bufWrapper == String(\"aaaa\")"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_778);
  for (bufWrapper_1._data.ref = 0; bufWrapper_1._data.ref < 8;
      bufWrapper_1._data.ref = bufWrapper_1._data.ref + 1) {
    buf_1[bufWrapper_1._data.ref - 8] = 'a';
  }
  String::String((String *)local_818);
  buf_1[0] = '\0';
  String::attach((String *)local_818,(char *)&i_2,8);
  String::detach((String *)local_818);
  i_2._2_1_ = 0x62;
  bVar2 = String::operator==((String *)local_818,(char (*) [9])"aaaaaaaa");
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x82,"bufWrapper == \"aaaaaaaa\""), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String((String *)local_818);
  String::String(&local_840);
  pSVar7 = String::trim(&local_840," \t\r\n\v");
  String::String(&local_868);
  bVar2 = String::operator==(pSVar7,&local_868);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x86,"String().trim() == String()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_868);
  String::~String(&local_840);
  String::String<7ul>(&local_890,(char (*) [7])"\t \n\t \n");
  pSVar7 = String::trim(&local_890," \t\r\n\v");
  String::String(&local_8b8);
  bVar2 = String::operator==(pSVar7,&local_8b8);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x87,"String(\"\\t \\n\\t \\n\").trim() == String()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_8b8);
  String::~String(&local_890);
  String::String<8ul>(&local_8e0,(char (*) [8])"\t \nx\t \n");
  pSVar7 = String::trim(&local_8e0," \t\r\n\v");
  bVar2 = String::operator==(pSVar7,(char (*) [2])0x10f896);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x88,"String(\"\\t \\nx\\t \\n\").trim() == \"x\""), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_8e0);
  String::String<5ul>(&local_908,(char (*) [5])0x10f84b);
  pSVar7 = String::trim(&local_908," \t\r\n\v");
  bVar2 = String::operator==(pSVar7,(char (*) [2])0x10f896);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x89,"String(\"x\\t \\n\").trim() == \"x\""), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_908);
  String::String<5ul>(&local_930,(char (*) [5])"\t \nx");
  pSVar7 = String::trim(&local_930," \t\r\n\v");
  bVar2 = String::operator==(pSVar7,(char (*) [2])0x10f896);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x8a,"String(\"\\t \\nx\").trim() == \"x\""), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_930);
  String::String<2ul>(&local_958,(char (*) [2])0x10f896);
  pSVar7 = String::trim(&local_958," \t\r\n\v");
  bVar2 = String::operator==(pSVar7,(char (*) [2])0x10f896);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x8b,"String(\"x\").trim() == \"x\""), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_958);
  String::String(&local_980);
  bVar2 = String::toBool(&local_980);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x8e,"!String().toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_980);
  String::String<1ul>(&local_9a8,(char (*) [1])0x10f81f);
  bVar2 = String::toBool(&local_9a8);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x8f,"!String(\"\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_9a8);
  String::String<2ul>(&local_9d0,(char (*) [2])0x10fe40);
  bVar2 = String::toBool(&local_9d0);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x90,"!String(\"0\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_9d0);
  String::String<6ul>(&local_9f8,(char (*) [6])"false");
  bVar2 = String::toBool(&local_9f8);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x91,"!String(\"false\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_9f8);
  String::String<6ul>(&local_a20,(char (*) [6])"False");
  bVar2 = String::toBool(&local_a20);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x92,"!String(\"False\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_a20);
  String::String<6ul>(&local_a48,(char (*) [6])"falSe");
  bVar2 = String::toBool(&local_a48);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x93,"!String(\"falSe\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_a48);
  String::String<4ul>(&local_a70,(char (*) [4])0x10fa23);
  bVar2 = String::toBool(&local_a70);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x94,"!String(\"0.0\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_a70);
  String::String<3ul>(&local_a98,(char (*) [3])0x10fa24);
  bVar2 = String::toBool(&local_a98);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x95,"!String(\".0\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_a98);
  String::String<3ul>(&local_ac0,(char (*) [3])0x10f9ce);
  bVar2 = String::toBool(&local_ac0);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x96,"!String(\"0.\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_ac0);
  String::String<4ul>(&local_ae8,(char (*) [4])0x10f9eb);
  bVar2 = String::toBool(&local_ae8);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x97,"!String(\".00\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_ae8);
  String::String<4ul>(&local_b10,(char (*) [4])"00.");
  bVar2 = String::toBool(&local_b10);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x98,"!String(\"00.\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_b10);
  String::String<6ul>(&local_b38,(char (*) [6])"00.00");
  bVar2 = String::toBool(&local_b38);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x99,"!String(\"00.00\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_b38);
  String::String<5ul>(&local_b60,(char (*) [5])0x10f9ea);
  bVar2 = String::toBool(&local_b60);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x9a,"!String(\"0.00\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_b60);
  String::String<5ul>(&local_b88,(char (*) [5])"00.0");
  bVar2 = String::toBool(&local_b88);
  if ((bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x9b,"!String(\"00.0\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_b88);
  String::String<2ul>(&local_bb0,(char (*) [2])0x10f9cf);
  bVar2 = String::toBool(&local_bb0);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x9c,"String(\".\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_bb0);
  String::String<7ul>(&local_bd8,(char (*) [7])"dasdas");
  bVar2 = String::toBool(&local_bd8);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x9d,"String(\"dasdas\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_bd8);
  String::String<5ul>((String *)&str._data.ref,(char (*) [5])"true");
  bVar2 = String::toBool((String *)&str._data.ref);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0x9e,"String(\"true\").toBool()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String((String *)&str._data.ref);
  String::String((String *)local_c28);
  List<String>::List(&local_c88);
  pSVar7 = String::join((String *)local_c28,&local_c88,'.');
  String::String(&local_cb0);
  bVar2 = String::operator==(pSVar7,&local_cb0);
  if ((!bVar2) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                            ,0xa3,"str.join(List<String>(), \'.\') == String()"), iVar4 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  String::~String(&local_cb0);
  List<String>::~List(&local_c88);
  String::~String((String *)local_c28);
  String::~String((String *)local_728);
  String::~String((String *)&caa);
  String::~String((String *)local_5c0);
  String::~String((String *)&c._data.ref);
  String::~String((String *)&a._data.ref);
  String::~String((String *)&b._data.ref);
  String::~String((String *)local_518);
  String::~String((String *)&x._data.ref);
  String::~String((String *)&copyOfCopyOfHello._data.ref);
  String::~String((String *)&copyOfHello._data.ref);
  String::~String((String *)local_30);
  return;
}

Assistant:

void testString()
{
  // test constructors
  String empty;
  ASSERT(empty.isEmpty());
  String hello("hello");
  ASSERT(!hello.isEmpty());
  String copyOfHello(hello);
  ASSERT(!copyOfHello.isEmpty());
  String copyOfCopyOfHello(copyOfHello);
  ASSERT(!copyOfCopyOfHello.isEmpty());

  // test assignment operator
  {
    String x(copyOfCopyOfHello);
    x = copyOfHello;
    x = String("omg");
    String y("omg");
    y = y;
  }

  // test comparison
  ASSERT(String("123").compare("123") == 0);
  ASSERT(String("123").compare("xxx") != 0);
  ASSERT(String("1234").compare("123", 3) == 0);
  ASSERT(String("1234").compare("xxx", 3) != 0);
  ASSERT(String("123").compare("1234", 3) == 0);
  ASSERT(String("xxx").compare("1234", 3) != 0);

  // test ignore case comparison
  ASSERT(String("abc").compareIgnoreCase("ABC") == 0);
  ASSERT(String("abc").compareIgnoreCase("xxx") != 0);
  ASSERT(String("abcd").compareIgnoreCase("ABC", 3) == 0);
  ASSERT(String("abcd").compareIgnoreCase("xxx", 3) != 0);
  ASSERT(String("abc").compareIgnoreCase("ABCD", 3) == 0);
  ASSERT(String("xxx").compareIgnoreCase("ABCD", 3) != 0);

  // test self assign
  String blupp;
  blupp.printf("%d", 123);
  blupp = blupp;
  ASSERT(blupp == "123");

  // test compare operators
  ASSERT(hello == copyOfCopyOfHello);
  ASSERT(copyOfHello == copyOfCopyOfHello);
  ASSERT(hello == copyOfCopyOfHello);
  ASSERT(hello != empty);
  ASSERT(copyOfHello != empty);
  ASSERT(copyOfCopyOfHello != empty);
  ASSERT(!(hello == empty));
  ASSERT(!(copyOfHello == empty));
  ASSERT(!(copyOfCopyOfHello == empty));

  // test clear
  copyOfHello.clear();
  ASSERT(copyOfHello.isEmpty());

  // test toUpperCase, toLowerCase, isSpace
  for (int i = 0; i < 0x100; ++i)
  {
    ASSERT(String::toUpperCase((char)i) == (char)toupper((uchar&)i));
    ASSERT(String::toLowerCase((char)i) == (char)tolower((uchar&)i));
    ASSERT(String::isSpace((char)i) == !!isspace((uchar&)i));
  }

  // test static length
  ASSERT(String::length("") == 0);
  ASSERT(String::length("123") == 3);

  // test find methods
  String test("this is the find test test string");
  ASSERT(test.find('z') == 0);
  ASSERT(test.find("zz") == 0);
  ASSERT(String::compare(test.find('i'), "is is the find test test string") == 0);
  ASSERT(String::compare(test.findLast('i'), "ing") == 0);
  ASSERT(String::compare(test.find("is"), "is is the find test test string") == 0);
  ASSERT(String::compare(test.findLast("is"), "is the find test test string") == 0);
  ASSERT(String::compare(test.findOneOf("ex"), "e find test test string") == 0);
  ASSERT(String::compare(test.findOneOf("xe"), "e find test test string") == 0);
  ASSERT(String::compare(test.findLastOf("ex"), "est string") == 0);
  ASSERT(String::compare(test.findLastOf("xe"), "est string") == 0);

  // test prepend, append
  String b(" b ");
  String a("aa");
  String c("cc");
  ASSERT(a + b + c == "aa b cc");
  ASSERT(String().append(a).append(b).append(c) == "aa b cc");
  ASSERT(String().append(b).prepend(a).append(c) == "aa b cc");

  // test if lazy copying
  struct LazyCopyTest
  {
    static String test1()
    {
      return String("test");
    }
  };
  String aa = LazyCopyTest::test1(); // so, this is equal to "String aa("test")"?
  const char* caa = aa;
  ASSERT(caa != (char*)aa);

  // test external buffer attaching
  char buf[100];
  for(char* i = buf; i < buf + 8; ++i)
    *i = 'a';
  String bufWrapper;
  bufWrapper.attach(buf, 4);
  ASSERT(bufWrapper == String(buf, 4));
  ASSERT(bufWrapper == String("aaaa"));

  // test detach
  {
    char buf[100];
    for(usize i = 0; i < 8; ++i)
      buf[i] = 'a';
    String bufWrapper;
    buf[8] = '\0';
    bufWrapper.attach(buf, 8);
    bufWrapper.detach();
    buf[2] = 'b';
    ASSERT(bufWrapper == "aaaaaaaa");
  }

  // test trim
  ASSERT(String().trim() == String());
  ASSERT(String("\t \n\t \n").trim() == String());
  ASSERT(String("\t \nx\t \n").trim() == "x");
  ASSERT(String("x\t \n").trim() == "x");
  ASSERT(String("\t \nx").trim() == "x");
  ASSERT(String("x").trim() == "x");

  // test toBool
  ASSERT(!String().toBool());
  ASSERT(!String("").toBool());
  ASSERT(!String("0").toBool());
  ASSERT(!String("false").toBool());
  ASSERT(!String("False").toBool());
  ASSERT(!String("falSe").toBool());
  ASSERT(!String("0.0").toBool());
  ASSERT(!String(".0").toBool());
  ASSERT(!String("0.").toBool());
  ASSERT(!String(".00").toBool());
  ASSERT(!String("00.").toBool());
  ASSERT(!String("00.00").toBool());
  ASSERT(!String("0.00").toBool());
  ASSERT(!String("00.0").toBool());
  ASSERT(String(".").toBool());
  ASSERT(String("dasdas").toBool());
  ASSERT(String("true").toBool());

  // test join
  {
    String str;
    ASSERT(str.join(List<String>(), '.') == String());
  }
}